

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilTruth.h
# Opt level: O0

int Abc_TtCountOnes(word x)

{
  ulong uVar1;
  long lVar2;
  word x_local;
  
  uVar1 = x - (x >> 1 & 0x5555555555555555);
  uVar1 = (uVar1 & 0x3333333333333333) + (uVar1 >> 2 & 0x3333333333333333);
  uVar1 = uVar1 + (uVar1 >> 4) & 0xf0f0f0f0f0f0f0f;
  uVar1 = uVar1 + (uVar1 >> 8);
  lVar2 = uVar1 + (uVar1 >> 0x10);
  return (int)lVar2 + (int)((ulong)lVar2 >> 0x20) & 0xff;
}

Assistant:

static inline int Abc_TtCountOnes( word x )
{
    x = x - ((x >> 1) & ABC_CONST(0x5555555555555555));   
    x = (x & ABC_CONST(0x3333333333333333)) + ((x >> 2) & ABC_CONST(0x3333333333333333));    
    x = (x + (x >> 4)) & ABC_CONST(0x0F0F0F0F0F0F0F0F);    
    x = x + (x >> 8);
    x = x + (x >> 16);
    x = x + (x >> 32); 
    return (int)(x & 0xFF);
}